

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::updateTransitionMatricesWithMultipleModels
          (BeagleCPUImpl<double,_1,_0> *this,int *eigenIndices,int *categoryRateIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          double *edgeLengths,int count)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int in_stack_00000010;
  int *secondDeriv;
  int *firstDeriv;
  int i;
  long local_50;
  long local_48;
  int local_3c;
  
  for (local_3c = 0; local_3c < in_stack_00000010; local_3c = local_3c + 1) {
    local_48 = 0;
    local_50 = 0;
    if ((in_R8 == 0) || (in_R9 != 0)) {
      if ((in_R8 != 0) && (in_R9 != 0)) {
        local_48 = in_R8 + (long)local_3c * 4;
        local_50 = in_R9 + (long)local_3c * 4;
      }
    }
    else {
      local_48 = in_R8 + (long)local_3c * 4;
    }
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x18))
              (*(long **)(in_RDI + 0x70),*(undefined4 *)(in_RSI + (long)local_3c * 4),
               in_RCX + (long)local_3c * 4,local_48,local_50,in_stack_00000008 + (long)local_3c * 8,
               *(undefined8 *)
                (*(long *)(in_RDI + 0x78) + (long)*(int *)(in_RDX + (long)local_3c * 4) * 8),
               *(undefined8 *)(in_RDI + 0xd8),1);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::updateTransitionMatricesWithMultipleModels(const int* eigenIndices,
                                                                                  const int* categoryRateIndices,
                                                                                  const int* probabilityIndices,
                                                                                  const int* firstDerivativeIndices,
                                                                                  const int* secondDerivativeIndices,
                                                                                  const double* edgeLengths,
                                                                                  int count) {

    // TODO: move loop to within gEigenDecomposition

    for (int i = 0; i < count; i++) {
        // printf("uTMWMM %d %d %f %d\n", eigenIndices[i], probabilityIndices[i], edgeLengths[i], categoryRateIndices[i]);

        const int* firstDeriv  = NULL;
        const int* secondDeriv = NULL;
        if (firstDerivativeIndices != NULL && secondDerivativeIndices == NULL) {
            firstDeriv = &firstDerivativeIndices[i];
        } else if (firstDerivativeIndices != NULL && secondDerivativeIndices != NULL) {
            firstDeriv  = &firstDerivativeIndices[i];
            secondDeriv = &secondDerivativeIndices[i];
        }

        gEigenDecomposition->updateTransitionMatrices(eigenIndices[i],
                                                      &probabilityIndices[i],
                                                      firstDeriv,
                                                      secondDeriv,
                                                      &edgeLengths[i],
                                                      gCategoryRates[categoryRateIndices[i]],
                                                      gTransitionMatrices,
                                                      1);
    }

    return BEAGLE_SUCCESS;
}